

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_4chan(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  exr_coding_channel_info_t *peVar13;
  int x;
  ulong uVar14;
  uint8_t *puVar15;
  long lVar16;
  uint8_t *puVar17;
  long lVar18;
  uint8_t *puVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  uint8_t *puVar24;
  long lVar25;
  long lVar26;
  uint8_t *local_68;
  
  pvVar12 = decode->unpacked_buffer;
  peVar13 = decode->channels;
  uVar1 = peVar13->width;
  lVar26 = (long)(int)uVar1;
  iVar2 = (decode->chunk).height;
  iVar3 = decode->user_line_end_ignore;
  iVar4 = peVar13->user_pixel_stride;
  iVar5 = peVar13[1].user_pixel_stride;
  iVar6 = peVar13[2].user_pixel_stride;
  iVar7 = peVar13[3].user_pixel_stride;
  iVar8 = peVar13->user_line_stride;
  iVar23 = decode->user_line_begin_skip;
  lVar20 = (long)(int)(uVar1 * 8);
  uVar21 = 0;
  if (0 < (int)uVar1) {
    uVar21 = (ulong)uVar1;
  }
  lVar18 = (long)(int)(uVar1 * 8 * iVar23);
  lVar16 = lVar18 + lVar26 * 2 + (long)pvVar12;
  lVar25 = lVar18 + lVar26 * 4 + (long)pvVar12;
  lVar22 = (long)pvVar12 + lVar18;
  lVar26 = (long)pvVar12 + lVar18 + lVar26 * 6;
  iVar9 = peVar13[1].user_line_stride;
  iVar10 = peVar13[2].user_line_stride;
  iVar11 = peVar13[3].user_line_stride;
  puVar15 = (peVar13->field_12).decode_to_ptr;
  local_68 = peVar13[1].field_12.decode_to_ptr;
  puVar17 = peVar13[2].field_12.decode_to_ptr;
  puVar19 = peVar13[3].field_12.decode_to_ptr;
  for (; iVar23 < iVar2 - iVar3; iVar23 = iVar23 + 1) {
    puVar24 = puVar15;
    for (uVar14 = 0; uVar21 != uVar14; uVar14 = uVar14 + 1) {
      *(undefined2 *)puVar24 = *(undefined2 *)(lVar22 + uVar14 * 2);
      puVar24 = puVar24 + iVar4;
    }
    puVar24 = local_68;
    for (uVar14 = 0; uVar21 != uVar14; uVar14 = uVar14 + 1) {
      *(undefined2 *)puVar24 = *(undefined2 *)(lVar16 + uVar14 * 2);
      puVar24 = puVar24 + iVar5;
    }
    puVar24 = puVar17;
    for (uVar14 = 0; uVar21 != uVar14; uVar14 = uVar14 + 1) {
      *(undefined2 *)puVar24 = *(undefined2 *)(lVar25 + uVar14 * 2);
      puVar24 = puVar24 + iVar6;
    }
    puVar24 = puVar19;
    for (uVar14 = 0; uVar21 != uVar14; uVar14 = uVar14 + 1) {
      *(undefined2 *)puVar24 = *(undefined2 *)(lVar26 + uVar14 * 2);
      puVar24 = puVar24 + iVar7;
    }
    lVar22 = lVar22 + lVar20;
    puVar15 = puVar15 + iVar8;
    local_68 = local_68 + iVar9;
    puVar17 = puVar17 + iVar10;
    puVar19 = puVar19 + iVar11;
    lVar16 = lVar16 + lVar20;
    lVar25 = lVar25 + lVar20;
    lVar26 = lVar26 + lVar20;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             inc0, inc1, inc2, inc3;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    inc3  = decode->channels[3].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += w * decode->user_line_begin_skip * 8;

    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out3 + x * inc3)) = one_to_native16 (in3[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}